

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O3

int Dau_DecVerify(word *pInit,int nVars,char *pDsdC,char *pDsdD)

{
  byte bVar1;
  uint uVar2;
  word *pwVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  word pC [8192];
  word pRes [8192];
  word pD [8192];
  ulong auStack_30038 [8192];
  ulong auStack_20038 [8192];
  ulong auStack_10038 [8193];
  
  bVar1 = (byte)nVars;
  iVar11 = 1 << (bVar1 - 5 & 0x1f);
  uVar8 = 1 << (bVar1 - 6 & 0x1f);
  if (nVars < 7) {
    uVar8 = 1;
  }
  if (0xf < nVars) {
    __assert_fail("nVars < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                  ,0x2b4,"int Dau_DecVerify(word *, int, char *, char *)");
  }
  iVar12 = 1;
  if (5 < nVars) {
    iVar12 = iVar11;
  }
  pwVar3 = Dau_DsdToTruth(pDsdC,nVars + 1);
  memcpy(auStack_30038,pwVar3,(long)iVar12 << 3);
  pwVar3 = Dau_DsdToTruth(pDsdD,nVars);
  memcpy(auStack_10038,pwVar3,(long)(int)uVar8 * 8);
  if (nVars < 6) {
    if (nVars < 0) {
      __assert_fail("nVars >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x489,"word Abc_Tt6Stretch(word, int)");
    }
    iVar11 = 4;
    if (4 < (uint)nVars) {
      iVar11 = nVars;
    }
    if (2 < iVar11 - 4U) {
      __assert_fail("nVars == 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x496,"word Abc_Tt6Stretch(word, int)");
    }
    uVar9 = (uint)auStack_30038[0];
    uVar2 = 1 << (bVar1 & 0x1f);
    uVar6 = auStack_30038[0] >> ((byte)uVar2 & 0x3f);
    uVar10 = -(uVar9 & 1);
    if (nVars != 0) {
      uVar10 = uVar9;
    }
    uVar5 = (uint)uVar6;
    uVar2 = -(uint)((auStack_30038[0] >> ((ulong)uVar2 & 0x3f) & 1) != 0);
    if (nVars != 0) {
      uVar2 = uVar5;
    }
    uVar10 = (uVar10 & 3) * 5;
    if (1U < (uint)nVars) {
      uVar10 = uVar9;
    }
    uVar2 = (uVar2 & 3) * 5;
    if (1U < (uint)nVars) {
      uVar2 = uVar5;
    }
    uVar2 = uVar2 << 4 | uVar2 & 0xf;
    uVar10 = uVar10 << 4 | uVar10 & 0xf;
    if (2 < (uint)nVars) {
      uVar2 = uVar5;
      uVar10 = uVar9;
    }
    uVar2 = uVar2 << 8 | uVar2 & 0xff;
    uVar10 = uVar10 << 8 | uVar10 & 0xff;
    if (3 < (uint)nVars) {
      uVar2 = uVar5;
      uVar10 = uVar9;
    }
    uVar4 = (ulong)(uVar10 << 0x10 | uVar10 & 0xffff);
    if (4U < (uint)nVars) {
      uVar4 = auStack_30038[0];
    }
    uVar7 = (ulong)(uVar2 << 0x10 | uVar2 & 0xffff);
    if (4U < (uint)nVars) {
      uVar7 = uVar6;
    }
    uVar6 = uVar4 << 0x20 | uVar4 & 0xffffffff;
    auStack_20038[0] = ((uVar7 << 0x20 | uVar7 & 0xffffffff) ^ uVar6) & auStack_10038[0] ^ uVar6;
  }
  else {
    if ((int)uVar8 < 1) {
      __assert_fail("nWordsD >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                    ,0x2b9,"int Dau_DecVerify(word *, int, char *, char *)");
    }
    if (iVar11 < 2) {
      __assert_fail("nWordsC > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                    ,0x2ba,"int Dau_DecVerify(word *, int, char *, char *)");
    }
    uVar6 = 0;
    do {
      auStack_20038[uVar6] =
           (auStack_30038[(long)(int)uVar8 + uVar6] ^ auStack_30038[uVar6]) & auStack_10038[uVar6] ^
           auStack_30038[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  if (0 < (int)uVar8) {
    uVar6 = 0;
    do {
      if (pInit[uVar6] != auStack_20038[uVar6]) {
        printf("      Verification failed");
        break;
      }
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  putchar(10);
  return 1;
}

Assistant:

int Dau_DecVerify( word * pInit, int nVars, char * pDsdC, char * pDsdD )
{
    word pC[1<<13], pD[1<<13], pRes[1<<13]; // max = 16
    int nWordsC = Abc_TtWordNum(nVars+1);
    int nWordsD = Abc_TtWordNum(nVars);
    assert( nVars < 16 );
    memcpy( pC, Dau_DsdToTruth(pDsdC, nVars+1), sizeof(word) * nWordsC );
    memcpy( pD, Dau_DsdToTruth(pDsdD, nVars), sizeof(word) * nWordsD );
    if ( nVars >= 6 )
    {
        assert( nWordsD >= 1 );
        assert( nWordsC > 1 );
        Abc_TtMux( pRes, pD, pC + nWordsD, pC, nWordsD );
    }
    else
    {
        word pC0 = Abc_Tt6Stretch( pC[0], nVars );
        word pC1 = Abc_Tt6Stretch( (pC[0] >> (1 << nVars)), nVars );
        Abc_TtMux( pRes, pD, &pC1, &pC0, nWordsD );
    }
    if ( !Abc_TtEqual(pInit, pRes, nWordsD) )
        printf( "      Verification failed" );
//    else
//        printf( "      Verification successful" );
    printf( "\n" );
    return 1;
}